

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O0

char * read_file(char *filename)

{
  FILE *__stream;
  size_t __n;
  size_t sVar1;
  size_t read_size;
  size_t string_size;
  FILE *file;
  char *buffer;
  char *filename_local;
  
  __stream = fopen(filename,"r");
  if (__stream == (FILE *)0x0) {
    filename_local = (char *)0x0;
  }
  else {
    fseek(__stream,0,2);
    __n = ftell(__stream);
    rewind(__stream);
    filename_local = (char *)malloc(__n + 1);
    sVar1 = fread(filename_local,1,__n,__stream);
    if (__n == sVar1) {
      filename_local[__n] = '\0';
    }
    else {
      free(filename_local);
      filename_local = (char *)0x0;
    }
  }
  return filename_local;
}

Assistant:

char *read_file(const char *filename) {
  char *buffer;
  FILE *file = fopen(filename, "r");

  if (file) {
    fseek(file, 0, SEEK_END);

    size_t string_size = (size_t) ftell(file);

    rewind(file);

    buffer = malloc(sizeof(char) * (string_size + 1));

    size_t read_size = fread(buffer, sizeof(char), string_size, file);

    if (string_size != read_size) {
      free(buffer);
      return NULL;
    }

    buffer[string_size] = 0;

    return buffer;
  }

  return NULL;
}